

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::MacOSXContentGeneratorType::operator()
          (MacOSXContentGeneratorType *this,cmSourceFile *source,char *pkgloc,string *config)

{
  cmMakefileTargetGenerator *pcVar1;
  bool bVar2;
  string *filename;
  string_view source_00;
  string_view source_01;
  char local_179;
  string output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  cmAlphaNum local_138;
  string copyEcho;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_d0;
  string macdir;
  string local_90;
  string copyCommand;
  cmAlphaNum local_50;
  
  bVar2 = cmGeneratorTarget::IsBundleOnApple
                    ((this->Generator->super_cmCommonTargetGenerator).GeneratorTarget);
  if (bVar2) {
    cmOSXBundleGenerator::InitMacOSXContentDirectory
              (&macdir,(this->Generator->OSXBundleGenerator)._M_t.
                       super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
                       .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl,pkgloc,
               config);
    filename = cmSourceFile::GetFullPath_abi_cxx11_(source);
    local_138.View_._M_len = macdir._M_string_length;
    local_138.View_._M_str = macdir._M_dataplus._M_p;
    local_50.View_._M_str = local_50.Digits_;
    local_50.View_._M_len = 1;
    local_50.Digits_[0] = '/';
    cmsys::SystemTools::GetFilenameName(&copyEcho,filename);
    cmStrCat<std::__cxx11::string>(&output,&local_138,&local_50,&copyEcho);
    std::__cxx11::string::~string((string *)&copyEcho);
    pcVar1 = this->Generator;
    cmOutputConverter::MaybeRelativeToCurBinDir
              ((string *)&local_138,
               &(pcVar1->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&output);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&pcVar1->CleanFiles,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    cmOutputConverter::MaybeRelativeToTopBinDir
              ((string *)&local_138,
               &(this->Generator->LocalGenerator->super_cmLocalCommonGenerator).
                super_cmLocalGenerator.super_cmOutputConverter,&output);
    std::__cxx11::string::operator=((string *)&output,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&depends,filename);
    local_138.View_._M_len = 0x15;
    local_138.View_._M_str = "Copying OS X content ";
    local_50.View_._M_len = output._M_string_length;
    local_50.View_._M_str = output._M_dataplus._M_p;
    cmStrCat<>(&copyEcho,&local_138,&local_50);
    cmLocalUnixMakefileGenerator3::AppendEcho
              (this->Generator->LocalGenerator,&commands,&copyEcho,EchoBuild,(EchoProgress *)0x0);
    local_138.View_._M_len = 0x19;
    local_138.View_._M_str = "$(CMAKE_COMMAND) -E copy ";
    source_00._M_str = (filename->_M_dataplus)._M_p;
    source_00._M_len = filename->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_d0,
               &(this->Generator->LocalGenerator->super_cmLocalCommonGenerator).
                super_cmLocalGenerator.super_cmOutputConverter,source_00,SHELL);
    local_50.View_._M_len = local_d0._M_string_length;
    local_50.View_._M_str = local_d0._M_dataplus._M_p;
    local_179 = ' ';
    source_01._M_str = output._M_dataplus._M_p;
    source_01._M_len = output._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_90,
               &(this->Generator->LocalGenerator->super_cmLocalCommonGenerator).
                super_cmLocalGenerator.super_cmOutputConverter,source_01,SHELL);
    cmStrCat<char,std::__cxx11::string>(&copyCommand,&local_138,&local_50,&local_179,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
               &copyCommand);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this->Generator->LocalGenerator,
               (ostream *)
               (this->Generator->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,(char *)0x0,
               &output,&depends,&commands,false,false);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->Generator->ExtraFiles,&output);
    std::__cxx11::string::~string((string *)&copyCommand);
    std::__cxx11::string::~string((string *)&copyEcho);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&macdir);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::MacOSXContentGeneratorType::operator()(
  cmSourceFile const& source, const char* pkgloc, const std::string& config)
{
  // Skip OS X content when not building a Framework or Bundle.
  if (!this->Generator->GetGeneratorTarget()->IsBundleOnApple()) {
    return;
  }

  std::string macdir =
    this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(pkgloc,
                                                                    config);

  // Get the input file location.
  std::string const& input = source.GetFullPath();

  // Get the output file location.
  std::string output =
    cmStrCat(macdir, '/', cmSystemTools::GetFilenameName(input));
  this->Generator->CleanFiles.insert(
    this->Generator->LocalGenerator->MaybeRelativeToCurBinDir(output));
  output = this->Generator->LocalGenerator->MaybeRelativeToTopBinDir(output);

  // Create a rule to copy the content into the bundle.
  std::vector<std::string> depends;
  std::vector<std::string> commands;
  depends.push_back(input);
  std::string copyEcho = cmStrCat("Copying OS X content ", output);
  this->Generator->LocalGenerator->AppendEcho(
    commands, copyEcho, cmLocalUnixMakefileGenerator3::EchoBuild);
  std::string copyCommand =
    cmStrCat("$(CMAKE_COMMAND) -E copy ",
             this->Generator->LocalGenerator->ConvertToOutputFormat(
               input, cmOutputConverter::SHELL),
             ' ',
             this->Generator->LocalGenerator->ConvertToOutputFormat(
               output, cmOutputConverter::SHELL));
  commands.push_back(std::move(copyCommand));
  this->Generator->LocalGenerator->WriteMakeRule(
    *this->Generator->BuildFileStream, nullptr, output, depends, commands,
    false);
  this->Generator->ExtraFiles.insert(output);
}